

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_pragmas.cpp
# Opt level: O3

optional<unsigned_int> __thiscall
slang::parsing::Preprocessor::requireUInt32(Preprocessor *this,PragmaExpressionSyntax *expr)

{
  SyntaxKind SVar1;
  double value;
  SimplePragmaExpressionSyntax *pSVar2;
  _Optional_payload_base<int> _Var3;
  ulong uVar4;
  SourceRange SVar5;
  Token token;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  byte local_3b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  Info *pIStack_30;
  
  SVar1 = (expr->super_SyntaxNode).kind;
  if (SVar1 == NumberPragmaExpression) {
    slang::syntax::SyntaxNode::as<slang::syntax::NumberPragmaExpressionSyntax>
              (&expr->super_SyntaxNode);
    Token::intValue((Token *)&local_38);
    _Var3 = (_Optional_payload_base<int>)SVInt::as<int,void>((SVInt *)&local_38);
    uVar4 = 0x100000000;
    if (((ulong)_Var3 & 0x180000000) != 0x100000000) {
      SVar5 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
      addDiag(this,(DiagCode)0x240004,SVar5);
      uVar4 = 0;
    }
    local_48 = local_38;
    if (((uint)pIStack_30 < 0x41) && (((ulong)pIStack_30 & 0x10000000000) == 0)) goto LAB_001a15b7;
  }
  else {
    if (SVar1 != SimplePragmaExpression) {
LAB_001a149b:
      SVar5 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
      addDiag(this,(DiagCode)0x240004,SVar5);
      _Var3._M_payload = (_Storage<int,_true>)0x0;
      _Var3._M_engaged = false;
      _Var3._5_3_ = 0;
      uVar4 = 0;
      goto LAB_001a15b7;
    }
    pSVar2 = slang::syntax::SyntaxNode::as<slang::syntax::SimplePragmaExpressionSyntax>
                       (&expr->super_SyntaxNode);
    local_38 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
               *(anon_union_8_2_628a4eb3_for_SVIntStorage_0 *)&pSVar2->value;
    pIStack_30 = (pSVar2->value).info;
    if (local_38.val._0_2_ == 8) {
      value = Token::realValue((Token *)&local_38);
      SVInt::fromDouble((SVInt *)&local_48,0x20,value,true);
      _Var3 = (_Optional_payload_base<int>)SVInt::as<int,void>((SVInt *)&local_48);
      uVar4 = 0x100000000;
      if (((ulong)_Var3 & 0x180000000) != 0x100000000) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
        addDiag(this,(DiagCode)0x240004,SVar5);
LAB_001a1598:
        uVar4 = 0;
      }
    }
    else {
      if (local_38.val._0_2_ != 5) goto LAB_001a149b;
      Token::intValue((Token *)&local_48);
      _Var3 = (_Optional_payload_base<int>)SVInt::as<int,void>((SVInt *)&local_48);
      uVar4 = 0x100000000;
      if (((ulong)_Var3 & 0x180000000) != 0x100000000) {
        SVar5 = slang::syntax::SyntaxNode::sourceRange(&expr->super_SyntaxNode);
        addDiag(this,(DiagCode)0x240004,SVar5);
        goto LAB_001a1598;
      }
    }
    if ((local_40 < 0x41) && ((local_3b & 1) == 0)) goto LAB_001a15b7;
  }
  if ((void *)local_48.val != (void *)0x0) {
    operator_delete__(local_48.pVal);
  }
LAB_001a15b7:
  return (optional<unsigned_int>)((ulong)_Var3 & 0xffffffff | uVar4);
}

Assistant:

std::optional<uint32_t> Preprocessor::requireUInt32(const PragmaExpressionSyntax& expr) {
    auto checkResult = [&](const SVInt& svi) -> std::optional<uint32_t> {
        auto value = svi.as<int32_t>();
        if (!value || *value < 0) {
            addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
            return {};
        }

        return uint32_t(*value);
    };

    if (expr.kind == SyntaxKind::SimplePragmaExpression) {
        auto token = expr.as<SimplePragmaExpressionSyntax>().value;
        if (token.kind == TokenKind::IntegerLiteral)
            return checkResult(token.intValue());
        else if (token.kind == TokenKind::RealLiteral)
            return checkResult(SVInt::fromDouble(32, token.realValue(), true));
    }
    else if (expr.kind == SyntaxKind::NumberPragmaExpression) {
        return checkResult(expr.as<NumberPragmaExpressionSyntax>().value.intValue());
    }

    addDiag(diag::InvalidPragmaNumber, expr.sourceRange());
    return {};
}